

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O1

bool __thiscall Builder::FinishCommand(Builder *this,Result *result,string *err)

{
  Edge *this_00;
  _Base_ptr p_Var1;
  BuildLog *this_01;
  Metrics *this_02;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  _Base_ptr p_Var6;
  int64_t iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  long *plVar13;
  Metric *pMVar14;
  long *plVar15;
  iterator __position;
  pointer ppNVar16;
  bool bVar17;
  string rspfile;
  string deps_prefix;
  vector<Node_*,_std::allocator<Node_*>_> deps_nodes;
  string deps_type;
  ScopedMetric metrics_h_scoped;
  string local_140;
  string *local_120;
  string local_118;
  int local_f4;
  long *local_f0 [2];
  long local_e0 [2];
  long local_d0;
  vector<Node_*,_std::allocator<Node_*>_> local_c8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  string local_90;
  DependencyScan *local_70;
  Plan *local_68;
  string local_60;
  ScopedMetric local_40;
  
  local_120 = err;
  if ((FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::metrics_h_metric == '\0') &&
     (iVar5 = __cxa_guard_acquire(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                                   metrics_h_metric), this_02 = g_metrics, iVar5 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar14 = (Metric *)0x0;
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"FinishCommand","");
      pMVar14 = Metrics::NewMetric(this_02,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    FinishCommand::metrics_h_metric = pMVar14;
    __cxa_guard_release(&FinishCommand(CommandRunner::Result*,std::__cxx11::string*)::
                         metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,FinishCommand::metrics_h_metric);
  this_00 = result->edge;
  local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"deps","");
  Edge::GetBinding(&local_90,this_00,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"msvc_deps_prefix","");
  Edge::GetBinding(&local_118,this_00,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
  if (local_90._M_string_length != 0) {
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    local_140._M_string_length = 0;
    local_140.field_2._M_local_buf[0] = '\0';
    bVar2 = ExtractDeps(this,result,&local_90,&local_118,&local_c8,&local_140);
    if ((!bVar2) && (result->status == ExitSuccess)) {
      if ((result->output)._M_string_length != 0) {
        std::__cxx11::string::append((char *)&result->output);
      }
      std::__cxx11::string::_M_append((char *)&result->output,(ulong)local_140._M_dataplus._M_p);
      result->status = ExitFailure;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,
                      CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                               local_140.field_2._M_local_buf[0]) + 1);
    }
  }
  __position._M_node = &(this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var6 = __position._M_node;
  for (p_Var1 = (this->running_edges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Base_ptr)0x0; p_Var1 = (&p_Var1->_M_left)[*(Edge **)(p_Var1 + 1) < this_00]) {
    if (*(Edge **)(p_Var1 + 1) >= this_00) {
      p_Var6 = p_Var1;
    }
  }
  if ((p_Var6 != __position._M_node) && (*(Edge **)(p_Var6 + 1) <= this_00)) {
    __position._M_node = p_Var6;
  }
  local_f4 = *(int *)&__position._M_node[1]._M_parent;
  iVar7 = GetTimeMillis();
  local_d0 = iVar7 - this->start_time_millis_;
  std::
  _Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
  ::erase_abi_cxx11_((_Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
                      *)&this->running_edges_,__position);
  (*this->status_->_vptr_Status[2])
            (this->status_,this_00,local_d0,(ulong)(result->status == ExitSuccess),&result->output);
  if (result->status != ExitSuccess) {
    bVar2 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeFailed,local_120);
    goto LAB_0010b463;
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"restat","");
  bVar2 = Edge::GetBindingBool(this_00,&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,
                    CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                             local_140.field_2._M_local_buf[0]) + 1);
  }
  if (this->config_[4] == (BuildConfig)0x0) {
    ppNVar16 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    bVar4 = ppNVar16 ==
            (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
    if (bVar4) {
      lVar11 = 0;
      bVar17 = false;
    }
    else {
      local_68 = &this->plan_;
      local_70 = &this->scan_;
      bVar17 = false;
      lVar11 = 0;
      do {
        lVar8 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                          (this->disk_interface_,*ppNVar16,local_120);
        if (lVar8 == -1) {
          bVar3 = false;
        }
        else {
          if (lVar11 < lVar8) {
            lVar11 = lVar8;
          }
          bVar3 = true;
          if (((*ppNVar16)->mtime_ == lVar8 && bVar2) &&
             (bVar3 = Plan::CleanNode(local_68,local_70,*ppNVar16,local_120), bVar3)) {
            bVar17 = true;
          }
        }
        if (bVar3 == false) break;
        ppNVar16 = ppNVar16 + 1;
        bVar4 = ppNVar16 ==
                (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      } while (!bVar4);
    }
    if ((bVar4) && (bVar17)) {
      ppNVar16 = (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      bVar2 = ppNVar16 ==
              (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
      if (bVar2) {
        lVar8 = 0;
      }
      else {
        lVar8 = 0;
        do {
          lVar9 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                            (this->disk_interface_,*ppNVar16,local_120);
          lVar10 = lVar8;
          if (lVar8 < lVar9) {
            lVar10 = lVar9;
          }
          if (lVar9 == -1) break;
          ppNVar16 = ppNVar16 + 1;
          bVar2 = ppNVar16 ==
                  (this_00->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish + -(long)this_00->order_only_deps_;
          lVar8 = lVar10;
        } while (!bVar2);
      }
      if (bVar2) {
        Edge::GetUnescapedDepfile_abi_cxx11_(&local_140,this_00);
        if (lVar8 == 0) {
          lVar8 = 0;
LAB_0010b4db:
          bVar4 = true;
          (**this->status_->_vptr_Status)(this->status_,(ulong)(uint)(this->plan_).command_edges_);
        }
        else {
          if ((local_90._M_string_length != 0) || (local_140._M_string_length == 0))
          goto LAB_0010b4db;
          lVar10 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                             (this->disk_interface_,&local_140,local_120);
          if (lVar8 < lVar10) {
            lVar8 = lVar10;
          }
          if (lVar10 != -1) goto LAB_0010b4db;
          bVar4 = false;
          lVar8 = lVar11;
        }
        lVar11 = lVar8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,
                          CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                   local_140.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        bVar4 = false;
      }
    }
    if (bVar4) goto LAB_0010b263;
  }
  else {
    lVar11 = 0;
LAB_0010b263:
    bVar2 = Plan::EdgeFinished(&this->plan_,this_00,kEdgeSucceeded,local_120);
    if (bVar2) {
      Edge::GetUnescapedRspfile_abi_cxx11_(&local_140,this_00);
      if ((local_140._M_string_length != 0) && (g_keep_rsp == false)) {
        (**(code **)(*(long *)this->disk_interface_ + 0x30))(this->disk_interface_,&local_140);
      }
      this_01 = (this->scan_).build_log_;
      if ((this_01 == (BuildLog *)0x0) ||
         (bVar2 = BuildLog::RecordCommand(this_01,this_00,local_f4,(int)local_d0,lVar11), bVar2)) {
        bVar2 = true;
        if ((local_90._M_string_length != 0) && (this->config_[4] == (BuildConfig)0x0)) {
          ppNVar16 = (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          if (ppNVar16 ==
              (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            __assert_fail("!edge->outputs_.empty() && \"should have been rejected by parser\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build.cc"
                          ,899,"bool Builder::FinishCommand(CommandRunner::Result *, string *)");
          }
          if (ppNVar16 !=
              (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            do {
              lVar11 = (**(code **)(*(long *)this->disk_interface_ + 0x18))
                                 (this->disk_interface_,*ppNVar16,local_120);
              bVar2 = lVar11 != -1;
              if (lVar11 == -1) break;
              bVar4 = DepsLog::RecordDeps((this->scan_).dep_loader_.deps_log_,*ppNVar16,lVar11,
                                          &local_c8);
              if (!bVar4) {
                local_f0[0] = local_e0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_f0,"Error writing to deps log: ","");
                piVar12 = __errno_location();
                strerror(*piVar12);
                plVar13 = (long *)std::__cxx11::string::append((char *)local_f0);
                goto LAB_0010b3ae;
              }
              ppNVar16 = ppNVar16 + 1;
            } while (ppNVar16 !=
                     (this_00->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
                     .super__Vector_impl_data._M_finish);
          }
        }
      }
      else {
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_f0,"Error writing to build log: ","");
        piVar12 = __errno_location();
        strerror(*piVar12);
        plVar13 = (long *)std::__cxx11::string::append((char *)local_f0);
LAB_0010b3ae:
        plVar15 = plVar13 + 2;
        if ((long *)*plVar13 == plVar15) {
          local_a0 = *plVar15;
          lStack_98 = plVar13[3];
          local_b0 = &local_a0;
        }
        else {
          local_a0 = *plVar15;
          local_b0 = (long *)*plVar13;
        }
        local_a8 = plVar13[1];
        *plVar13 = (long)plVar15;
        plVar13[1] = 0;
        *(undefined1 *)(plVar13 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_120,(string *)&local_b0);
        if (local_b0 != &local_a0) {
          operator_delete(local_b0,local_a0 + 1);
        }
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0],local_e0[0] + 1);
        }
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,
                        CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                 local_140.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0010b463;
    }
  }
  bVar2 = false;
LAB_0010b463:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar2;
}

Assistant:

bool Builder::FinishCommand(CommandRunner::Result* result, string* err) {
  METRIC_RECORD("FinishCommand");

  Edge* edge = result->edge;

  // First try to extract dependencies from the result, if any.
  // This must happen first as it filters the command output (we want
  // to filter /showIncludes output, even on compile failure) and
  // extraction itself can fail, which makes the command fail from a
  // build perspective.
  vector<Node*> deps_nodes;
  string deps_type = edge->GetBinding("deps");
  const string deps_prefix = edge->GetBinding("msvc_deps_prefix");
  if (!deps_type.empty()) {
    string extract_err;
    if (!ExtractDeps(result, deps_type, deps_prefix, &deps_nodes,
                     &extract_err) &&
        result->success()) {
      if (!result->output.empty())
        result->output.append("\n");
      result->output.append(extract_err);
      result->status = ExitFailure;
    }
  }

  int64_t start_time_millis, end_time_millis;
  RunningEdgeMap::iterator it = running_edges_.find(edge);
  start_time_millis = it->second;
  end_time_millis = GetTimeMillis() - start_time_millis_;
  running_edges_.erase(it);

  status_->BuildEdgeFinished(edge, end_time_millis, result->success(),
                             result->output);

  // The rest of this function only applies to successful commands.
  if (!result->success()) {
    return plan_.EdgeFinished(edge, Plan::kEdgeFailed, err);
  }

  // Restat the edge outputs
  TimeStamp output_mtime = 0;
  bool restat = edge->GetBindingBool("restat");
  if (!config_.dry_run) {
    bool node_cleaned = false;

    for (vector<Node*>::iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp new_mtime = disk_interface_->Stat((*o)->path(), err);
      if (new_mtime == -1)
        return false;
      if (new_mtime > output_mtime)
        output_mtime = new_mtime;
      if ((*o)->mtime() == new_mtime && restat) {
        // The rule command did not change the output.  Propagate the clean
        // state through the build graph.
        // Note that this also applies to nonexistent outputs (mtime == 0).
        if (!plan_.CleanNode(&scan_, *o, err))
          return false;
        node_cleaned = true;
      }
    }

    if (node_cleaned) {
      TimeStamp restat_mtime = 0;
      // If any output was cleaned, find the most recent mtime of any
      // (existing) non-order-only input or the depfile.
      for (vector<Node*>::iterator i = edge->inputs_.begin();
           i != edge->inputs_.end() - edge->order_only_deps_; ++i) {
        TimeStamp input_mtime = disk_interface_->Stat((*i)->path(), err);
        if (input_mtime == -1)
          return false;
        if (input_mtime > restat_mtime)
          restat_mtime = input_mtime;
      }

      string depfile = edge->GetUnescapedDepfile();
      if (restat_mtime != 0 && deps_type.empty() && !depfile.empty()) {
        TimeStamp depfile_mtime = disk_interface_->Stat(depfile, err);
        if (depfile_mtime == -1)
          return false;
        if (depfile_mtime > restat_mtime)
          restat_mtime = depfile_mtime;
      }

      // The total number of edges in the plan may have changed as a result
      // of a restat.
      status_->PlanHasTotalEdges(plan_.command_edge_count());

      output_mtime = restat_mtime;
    }
  }

  if (!plan_.EdgeFinished(edge, Plan::kEdgeSucceeded, err))
    return false;

  // Delete any left over response file.
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty() && !g_keep_rsp)
    disk_interface_->RemoveFile(rspfile);

  if (scan_.build_log()) {
    if (!scan_.build_log()->RecordCommand(edge, start_time_millis,
                                          end_time_millis, output_mtime)) {
      *err = string("Error writing to build log: ") + strerror(errno);
      return false;
    }
  }

  if (!deps_type.empty() && !config_.dry_run) {
    assert(!edge->outputs_.empty() && "should have been rejected by parser");
    for (std::vector<Node*>::const_iterator o = edge->outputs_.begin();
         o != edge->outputs_.end(); ++o) {
      TimeStamp deps_mtime = disk_interface_->Stat((*o)->path(), err);
      if (deps_mtime == -1)
        return false;
      if (!scan_.deps_log()->RecordDeps(*o, deps_mtime, deps_nodes)) {
        *err = std::string("Error writing to deps log: ") + strerror(errno);
        return false;
      }
    }
  }
  return true;
}